

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can_implicitly_cast.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BindCanCastImplicitlyExpression(duckdb *this,FunctionBindExpressionInput *input)

{
  reference pvVar1;
  pointer pEVar2;
  pointer pEVar3;
  LogicalType *pLVar4;
  BoundConstantExpression *pBVar5;
  Value local_a0 [64];
  Value local_60 [64];
  
  pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](*(vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                          **)(input + 0x10),0);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar1);
  pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](*(vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                          **)(input + 0x10),1);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar1);
  if (((byte)((char)pEVar2[0x38] - 1U) < 2) || ((byte)((char)pEVar3[0x38] - 1U) < 2)) {
    *(undefined8 *)this = 0;
  }
  else {
    pLVar4 = (LogicalType *)duckdb::CastFunctionSet::Get(*(ClientContext **)input);
    duckdb::CastFunctionSet::ImplicitCastCost(pLVar4,(LogicalType *)(pEVar2 + 0x38));
    duckdb::Value::BOOLEAN(SUB81(local_a0,0));
    pBVar5 = (BoundConstantExpression *)operator_new(0x98);
    duckdb::Value::Value(local_60,local_a0);
    duckdb::BoundConstantExpression::BoundConstantExpression(pBVar5,local_60);
    duckdb::Value::~Value(local_60);
    *(BoundConstantExpression **)this = pBVar5;
    duckdb::Value::~Value(local_a0);
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BindCanCastImplicitlyExpression(FunctionBindExpressionInput &input) {
	auto &source_type = input.children[0]->return_type;
	auto &target_type = input.children[1]->return_type;
	if (source_type.id() == LogicalTypeId::UNKNOWN || source_type.id() == LogicalTypeId::SQLNULL ||
	    target_type.id() == LogicalTypeId::UNKNOWN || target_type.id() == LogicalTypeId::SQLNULL) {
		// parameter - unknown return type
		return nullptr;
	}
	// emit a constant expression
	return make_uniq<BoundConstantExpression>(
	    Value::BOOLEAN(CanCastImplicitly(input.context, source_type, target_type)));
}